

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uprops.cpp
# Opt level: O2

UBool changesWhenCasefolded(BinaryProperty *param_1,UChar32 c,UProperty param_3)

{
  char16_t cVar1;
  int iVar2;
  uint uVar3;
  int32_t iVar4;
  Normalizer2 *pNVar5;
  undefined8 src;
  undefined4 uVar6;
  bool bVar7;
  UErrorCode errorCode;
  UnicodeString nfd;
  UChar *resultString;
  
  nfd.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003a7268;
  nfd.fUnion.fStackFields.fLengthAndFlags = 2;
  errorCode = U_ZERO_ERROR;
  pNVar5 = icu_63::Normalizer2::getNFCInstance(&errorCode);
  if (errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar2 = (*(pNVar5->super_UObject)._vptr_UObject[7])(pNVar5,c,&nfd);
    if ((char)iVar2 == '\0') {
      if (-1 < c) goto LAB_002b1204;
    }
    else {
      uVar3 = (uint)nfd.fUnion.fStackFields.fLengthAndFlags;
      uVar6 = nfd.fUnion.fFields.fLength;
      if (-1 < nfd.fUnion.fStackFields.fLengthAndFlags) {
        uVar6 = (int)uVar3 >> 5;
      }
      if (uVar6 == 1) {
        cVar1 = icu_63::UnicodeString::doCharAt(&nfd,0);
        c = (UChar32)(ushort)cVar1;
LAB_002b1204:
        iVar4 = ucase_toFullFolding_63(c,&resultString,0);
        bVar7 = -1 < iVar4;
        goto LAB_002b1217;
      }
      if ((int)uVar6 < 3) {
        c = icu_63::UnicodeString::char32At(&nfd,0);
        if ((-1 < c) && (uVar6 == 2 - (uint)((uint)c < 0x10000))) goto LAB_002b1204;
        uVar3 = (uint)(ushort)nfd.fUnion.fStackFields.fLengthAndFlags;
      }
      if ((uVar3 & 0x11) == 0) {
        src = nfd.fUnion.fFields.fArray;
        if ((uVar3 & 2) != 0) {
          src = nfd.fUnion.fStackFields.fBuffer;
        }
      }
      else {
        src = (char16_t *)0x0;
      }
      uVar6 = nfd.fUnion.fFields.fLength;
      if (-1 < (short)uVar3) {
        uVar6 = (int)(short)uVar3 >> 5;
      }
      iVar4 = u_strFoldCase_63((UChar *)&resultString,0x3e,(UChar *)src,uVar6,0,&errorCode);
      if (errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
        if ((nfd.fUnion.fStackFields.fLengthAndFlags & 0x11U) == 0) {
          if ((nfd.fUnion.fStackFields.fLengthAndFlags & 2U) != 0) {
            nfd.fUnion.fFields.fArray = nfd.fUnion.fStackFields.fBuffer;
          }
        }
        else {
          nfd.fUnion.fFields.fArray = (char16_t *)0x0;
        }
        if (-1 < nfd.fUnion.fStackFields.fLengthAndFlags) {
          nfd.fUnion.fFields.fLength = (int)nfd.fUnion.fStackFields.fLengthAndFlags >> 5;
        }
        iVar4 = u_strCompare_63(nfd.fUnion.fFields.fArray,nfd.fUnion.fFields.fLength,
                                (UChar *)&resultString,iVar4,'\0');
        bVar7 = iVar4 != 0;
        goto LAB_002b1217;
      }
    }
  }
  bVar7 = false;
LAB_002b1217:
  icu_63::UnicodeString::~UnicodeString(&nfd);
  return bVar7;
}

Assistant:

static UBool changesWhenCasefolded(const BinaryProperty &/*prop*/, UChar32 c, UProperty /*which*/) {
    UnicodeString nfd;
    UErrorCode errorCode=U_ZERO_ERROR;
    const Normalizer2 *nfcNorm2=Normalizer2::getNFCInstance(errorCode);
    if(U_FAILURE(errorCode)) {
        return FALSE;
    }
    if(nfcNorm2->getDecomposition(c, nfd)) {
        /* c has a decomposition */
        if(nfd.length()==1) {
            c=nfd[0];  /* single BMP code point */
        } else if(nfd.length()<=U16_MAX_LENGTH &&
                  nfd.length()==U16_LENGTH(c=nfd.char32At(0))
        ) {
            /* single supplementary code point */
        } else {
            c=U_SENTINEL;
        }
    } else if(c<0) {
        return FALSE;  /* protect against bad input */
    }
    if(c>=0) {
        /* single code point */
        const UChar *resultString;
        return (UBool)(ucase_toFullFolding(c, &resultString, U_FOLD_CASE_DEFAULT)>=0);
    } else {
        /* guess some large but stack-friendly capacity */
        UChar dest[2*UCASE_MAX_STRING_LENGTH];
        int32_t destLength;
        destLength=u_strFoldCase(dest, UPRV_LENGTHOF(dest),
                                  nfd.getBuffer(), nfd.length(),
                                  U_FOLD_CASE_DEFAULT, &errorCode);
        return (UBool)(U_SUCCESS(errorCode) &&
                       0!=u_strCompare(nfd.getBuffer(), nfd.length(),
                                       dest, destLength, FALSE));
    }
}